

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void test_base<long,unsigned_long,bool(*)(long,unsigned_long,long*),long(*)(long,unsigned_long),4>
               (char *type_str,_func_bool_long_unsigned_long_long_ptr *fcn1,
               _func_long_long_unsigned_long *fcn2)

{
  bool bVar1;
  runtime_error *prVar2;
  char *pcVar3;
  runtime_error *prVar4;
  string msg_1;
  safe_test<long,_unsigned_long> st;
  bool actual;
  string msg;
  bool result;
  check_test<long,_unsigned_long> ct;
  long ret;
  TestCase<long,_unsigned_long,_4> test;
  TestVector<long,_unsigned_long,_4> tests;
  unsigned_long in_stack_fffffffffffffe38;
  char *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  allocator *__lhs;
  TestVector<long,_unsigned_long,_4> *in_stack_fffffffffffffe50;
  byte local_180;
  allocator local_171;
  string local_170 [32];
  string local_150 [32];
  string local_130 [67];
  undefined1 local_ed;
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [70];
  undefined1 local_52;
  TestVector<long,_unsigned_long,_4> *local_50;
  byte local_38;
  TestVector<long,_unsigned_long,_4> local_30 [2];
  
  TestVector<long,_unsigned_long,_4>::TestVector(local_30);
  TestVector<long,_unsigned_long,_4>::GetNext(in_stack_fffffffffffffe50);
  while( true ) {
    bVar1 = TestVector<long,_unsigned_long,_4>::Done(local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    local_52 = check_test<long,unsigned_long>::operator()
                         ((check_test<long,_unsigned_long> *)in_stack_fffffffffffffe50,
                          (_func_bool_long_unsigned_long_long_ptr *)in_stack_fffffffffffffe48,
                          (long)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(long *)0x191606
                         );
    if (local_52 != (local_38 & 1)) break;
    in_stack_fffffffffffffe50 =
         (TestVector<long,_unsigned_long,_4> *)
         safe_test<long,unsigned_long>::operator()
                   ((safe_test<long,_unsigned_long> *)in_stack_fffffffffffffe50,
                    (_func_long_long_unsigned_long *)in_stack_fffffffffffffe48,
                    (long)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    local_ed = 1;
    local_50 = in_stack_fffffffffffffe50;
    if ((local_38 & 1) != 1) {
      __lhs = &local_171;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_170,"Failure in ",__lhs);
      OpName::op_name(4);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     in_stack_fffffffffffffe40);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     in_stack_fffffffffffffe40);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     in_stack_fffffffffffffe40);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_150);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      prVar2 = prVar4;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::runtime_error::runtime_error(prVar2,pcVar3);
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    TestVector<long,_unsigned_long,_4>::GetNext(in_stack_fffffffffffffe50);
    local_38 = local_180;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Failure in ",&local_d9);
  OpName::op_name(4);
  std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::operator+(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::runtime_error::runtime_error(prVar2,pcVar3);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}